

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O1

double __thiscall
soplex::SPxScaler<double>::getRowMinAbsUnscaled(SPxScaler<double> *this,SPxLPBase<double> *lp,int i)

{
  int iVar1;
  DataArray<int> *pDVar2;
  DataArray<int> *pDVar3;
  Nonzero<double> *pNVar4;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  Item *pIVar5;
  long lVar6;
  long lVar7;
  long in_FS_OFFSET;
  ulong uVar8;
  double dVar9;
  Real RVar10;
  double local_68;
  
  pDVar2 = this->m_activeColscaleExp;
  pDVar3 = this->m_activeRowscaleExp;
  pIVar5 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
           (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[i].idx;
  ::soplex::infinity::__tls_init();
  local_68 = *(double *)(in_FS_OFFSET + -8);
  if (0 < (pIVar5->data).super_SVectorBase<double>.memused) {
    iVar1 = pDVar3->data[i];
    lVar6 = 8;
    lVar7 = 0;
    do {
      pNVar4 = (pIVar5->data).super_SVectorBase<double>.m_elem;
      dVar9 = ldexp(*(double *)((long)pNVar4 + lVar6 + -8),
                    -(pDVar2->data[*(int *)((long)&pNVar4->val + lVar6)] + iVar1));
      this_00 = (this->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      this_01 = (this->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
      }
      RVar10 = Tolerances::epsilon(this_00);
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      uVar8 = -(ulong)(ABS(dVar9) - local_68 < -RVar10);
      local_68 = (double)(~uVar8 & (ulong)local_68 | uVar8 & (ulong)ABS(dVar9));
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x10;
    } while (lVar7 < (pIVar5->data).super_SVectorBase<double>.memused);
  }
  return local_68;
}

Assistant:

R SPxScaler<R>::getRowMinAbsUnscaled(const SPxLPBase<R>& lp, int i) const
{
   assert(i < lp.nRows());
   assert(i >= 0);
   DataArray < int >& colscaleExp = *m_activeColscaleExp;
   DataArray < int >& rowscaleExp = *m_activeRowscaleExp;
   const SVectorBase<R>& rowVec = lp.LPRowSetBase<R>::rowVector(i);

   R min = R(infinity);

   int exp1;
   int exp2 = rowscaleExp[i];

   for(int j = 0; j < rowVec.size(); j++)
   {
      exp1 = colscaleExp[rowVec.index(j)];
      R abs = spxAbs(spxLdexp(rowVec.value(j), -exp1 - exp2));

      if(LT(abs, min, this->tolerances()->epsilon()))
         min = abs;
   }

   return min;
}